

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_pa_buffer_attr *
ma_device__pa_buffer_attr_new
          (ma_pa_buffer_attr *__return_storage_ptr__,ma_uint32 periodSizeInFrames,ma_uint32 periods,
          ma_pa_sample_spec *ss)

{
  ma_pa_buffer_attr *pmVar1;
  uint uVar2;
  ma_uint32 mVar3;
  long lVar4;
  
  if ((ulong)(uint)ss->format < 10) {
    lVar4 = *(long *)(&DAT_00116038 + (ulong)(uint)ss->format * 8);
  }
  else {
    lVar4 = 0;
  }
  uVar2 = periodSizeInFrames * periods * (uint)ss->channels * (&DAT_001158a0)[lVar4];
  __return_storage_ptr__->maxlength = uVar2;
  pmVar1 = (ma_pa_buffer_attr *)((ulong)uVar2 / (ulong)periods);
  mVar3 = (ma_uint32)pmVar1;
  __return_storage_ptr__->tlength = mVar3;
  __return_storage_ptr__->prebuf = 0xffffffff;
  __return_storage_ptr__->minreq = 0xffffffff;
  __return_storage_ptr__->fragsize = mVar3;
  return pmVar1;
}

Assistant:

static ma_pa_buffer_attr ma_device__pa_buffer_attr_new(ma_uint32 periodSizeInFrames, ma_uint32 periods, const ma_pa_sample_spec* ss)
{
    ma_pa_buffer_attr attr;
    attr.maxlength = periodSizeInFrames * periods * ma_get_bytes_per_frame(ma_format_from_pulse(ss->format), ss->channels);
    attr.tlength   = attr.maxlength / periods;
    attr.prebuf    = (ma_uint32)-1;
    attr.minreq    = (ma_uint32)-1;
    attr.fragsize  = attr.maxlength / periods;

    return attr;
}